

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

void __thiscall
fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>>>::
write_padded<fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>>>::double_writer>
          (basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>>> *this,
          align_spec *spec,double_writer *f)

{
  ulong uVar1;
  wchar_t wVar2;
  size_t sVar3;
  undefined8 *puVar4;
  long lVar5;
  size_t sVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  char cVar10;
  wchar_t __tmp;
  size_t size;
  int *piVar11;
  ulong uVar12;
  ulong uVar13;
  long lVar14;
  char *pcVar15;
  ulong uVar16;
  basic_buffer<wchar_t> *c;
  int iVar22;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  int iVar29;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  
  uVar16 = (ulong)spec->width_;
  sVar3 = f->buffer->size_;
  cVar10 = f->sign;
  uVar13 = sVar3 + (cVar10 != '\0');
  puVar4 = *(undefined8 **)this;
  lVar14 = puVar4[2];
  uVar12 = uVar16 - uVar13;
  if (uVar16 < uVar13 || uVar12 == 0) {
    uVar13 = uVar13 + lVar14;
    if ((ulong)puVar4[3] < uVar13) {
      (**(code **)*puVar4)(puVar4,uVar13);
      cVar10 = f->sign;
    }
    puVar4[2] = uVar13;
    piVar11 = (int *)(lVar14 * 4 + puVar4[1]);
    if (cVar10 != '\0') {
      *piVar11 = (int)cVar10;
      piVar11 = piVar11 + 1;
      f->n = f->n - 1;
    }
    sVar3 = f->buffer->size_;
    if (0 < (long)sVar3) {
      pcVar15 = f->buffer->ptr_;
      uVar13 = sVar3 + 1;
      lVar14 = 0;
      do {
        piVar11[lVar14] = (int)pcVar15[lVar14];
        uVar13 = uVar13 - 1;
        lVar14 = lVar14 + 1;
      } while (1 < uVar13);
    }
  }
  else {
    uVar1 = lVar14 + uVar16;
    if ((ulong)puVar4[3] < uVar1) {
      (**(code **)*puVar4)(puVar4,uVar1);
    }
    puVar4[2] = uVar1;
    auVar9 = _DAT_00160db0;
    auVar8 = _DAT_0015d2a0;
    auVar7 = _DAT_0015d290;
    lVar5 = puVar4[1];
    piVar11 = (int *)(lVar5 + lVar14 * 4);
    wVar2 = spec->fill_;
    if (spec->align_ == ALIGN_CENTER) {
      uVar13 = uVar12 >> 1;
      if (1 < uVar12) {
        piVar11 = piVar11 + uVar13;
        uVar12 = uVar13 + 0x3fffffffffffffff & 0x3fffffffffffffff;
        auVar27._8_4_ = (int)uVar12;
        auVar27._0_8_ = uVar12;
        auVar27._12_4_ = (int)(uVar12 >> 0x20);
        lVar5 = lVar5 + lVar14 * 4;
        lVar14 = 0;
        auVar27 = auVar27 ^ _DAT_0015d2a0;
        do {
          auVar25._8_4_ = (int)lVar14;
          auVar25._0_8_ = lVar14;
          auVar25._12_4_ = (int)((ulong)lVar14 >> 0x20);
          auVar28 = (auVar25 | auVar7) ^ auVar8;
          iVar22 = auVar27._4_4_;
          if ((bool)(~(auVar28._4_4_ == iVar22 && auVar27._0_4_ < auVar28._0_4_ ||
                      iVar22 < auVar28._4_4_) & 1)) {
            *(wchar_t *)(lVar5 + lVar14 * 4) = wVar2;
          }
          if ((auVar28._12_4_ != auVar27._12_4_ || auVar28._8_4_ <= auVar27._8_4_) &&
              auVar28._12_4_ <= auVar27._12_4_) {
            *(wchar_t *)(lVar5 + 4 + lVar14 * 4) = wVar2;
          }
          auVar25 = (auVar25 | auVar9) ^ auVar8;
          iVar29 = auVar25._4_4_;
          if (iVar29 <= iVar22 && (iVar29 != iVar22 || auVar25._0_4_ <= auVar27._0_4_)) {
            *(wchar_t *)(lVar5 + 8 + lVar14 * 4) = wVar2;
            *(wchar_t *)(lVar5 + 0xc + lVar14 * 4) = wVar2;
          }
          lVar14 = lVar14 + 4;
        } while ((uVar12 - ((uint)(uVar13 + 0x3fffffffffffffff) & 3)) + 4 != lVar14);
      }
      if (f->sign != '\0') {
        *piVar11 = (int)f->sign;
        piVar11 = piVar11 + 1;
        f->n = f->n - 1;
      }
      sVar6 = f->buffer->size_;
      if (0 < (long)sVar6) {
        pcVar15 = f->buffer->ptr_;
        uVar12 = sVar6 + 1;
        do {
          *piVar11 = (int)*pcVar15;
          pcVar15 = pcVar15 + 1;
          piVar11 = piVar11 + 1;
          uVar12 = uVar12 - 1;
        } while (1 < uVar12);
      }
      auVar9 = _DAT_00160db0;
      auVar8 = _DAT_0015d2a0;
      auVar7 = _DAT_0015d290;
      uVar12 = (uVar16 * 4 + (sVar3 + uVar13 + (ulong)(cVar10 != '\0')) * -4) - 4;
      auVar28._8_4_ = (int)uVar12;
      auVar28._0_8_ = uVar12;
      auVar28._12_4_ = (int)(uVar12 >> 0x20);
      auVar21._0_8_ = uVar12 >> 2;
      auVar21._8_8_ = auVar28._8_8_ >> 2;
      uVar13 = 0;
      auVar21 = auVar21 ^ _DAT_0015d2a0;
      do {
        auVar26._8_4_ = (int)uVar13;
        auVar26._0_8_ = uVar13;
        auVar26._12_4_ = (int)(uVar13 >> 0x20);
        auVar27 = (auVar26 | auVar7) ^ auVar8;
        iVar22 = auVar21._4_4_;
        if ((bool)(~(auVar27._4_4_ == iVar22 && auVar21._0_4_ < auVar27._0_4_ ||
                    iVar22 < auVar27._4_4_) & 1)) {
          piVar11[uVar13] = wVar2;
        }
        if ((auVar27._12_4_ != auVar21._12_4_ || auVar27._8_4_ <= auVar21._8_4_) &&
            auVar27._12_4_ <= auVar21._12_4_) {
          piVar11[uVar13 + 1] = wVar2;
        }
        auVar27 = (auVar26 | auVar9) ^ auVar8;
        iVar29 = auVar27._4_4_;
        if (iVar29 <= iVar22 && (iVar29 != iVar22 || auVar27._0_4_ <= auVar21._0_4_)) {
          piVar11[uVar13 + 2] = wVar2;
          piVar11[uVar13 + 3] = wVar2;
        }
        uVar13 = uVar13 + 4;
      } while (((uVar12 >> 2) + 4 & 0x7ffffffffffffffc) != uVar13);
    }
    else if (spec->align_ == ALIGN_RIGHT) {
      piVar11 = piVar11 + uVar12;
      uVar12 = (uVar16 * 4 + uVar13 * -4) - 4;
      auVar17._8_4_ = (int)uVar12;
      auVar17._0_8_ = uVar12;
      auVar17._12_4_ = (int)(uVar12 >> 0x20);
      auVar18._0_8_ = uVar12 >> 2;
      auVar18._8_8_ = auVar17._8_8_ >> 2;
      lVar5 = lVar5 + lVar14 * 4;
      uVar13 = 0;
      auVar18 = auVar18 ^ _DAT_0015d2a0;
      do {
        auVar23._8_4_ = (int)uVar13;
        auVar23._0_8_ = uVar13;
        auVar23._12_4_ = (int)(uVar13 >> 0x20);
        auVar27 = (auVar23 | auVar7) ^ auVar8;
        iVar22 = auVar18._4_4_;
        if ((bool)(~(auVar27._4_4_ == iVar22 && auVar18._0_4_ < auVar27._0_4_ ||
                    iVar22 < auVar27._4_4_) & 1)) {
          *(wchar_t *)(lVar5 + uVar13 * 4) = wVar2;
        }
        if ((auVar27._12_4_ != auVar18._12_4_ || auVar27._8_4_ <= auVar18._8_4_) &&
            auVar27._12_4_ <= auVar18._12_4_) {
          *(wchar_t *)(lVar5 + 4 + uVar13 * 4) = wVar2;
        }
        auVar27 = (auVar23 | auVar9) ^ auVar8;
        iVar29 = auVar27._4_4_;
        if (iVar29 <= iVar22 && (iVar29 != iVar22 || auVar27._0_4_ <= auVar18._0_4_)) {
          *(wchar_t *)(lVar5 + 8 + uVar13 * 4) = wVar2;
          *(wchar_t *)(lVar5 + 0xc + uVar13 * 4) = wVar2;
        }
        uVar13 = uVar13 + 4;
      } while (((uVar12 >> 2) + 4 & 0x7ffffffffffffffc) != uVar13);
      if (f->sign != '\0') {
        *piVar11 = (int)f->sign;
        piVar11 = piVar11 + 1;
        f->n = f->n - 1;
      }
      sVar3 = f->buffer->size_;
      if (0 < (long)sVar3) {
        pcVar15 = f->buffer->ptr_;
        uVar13 = sVar3 + 1;
        lVar14 = 0;
        do {
          piVar11[lVar14] = (int)pcVar15[lVar14];
          uVar13 = uVar13 - 1;
          lVar14 = lVar14 + 1;
        } while (1 < uVar13);
      }
    }
    else {
      if (f->sign != '\0') {
        *piVar11 = (int)f->sign;
        piVar11 = piVar11 + 1;
        f->n = f->n - 1;
      }
      sVar3 = f->buffer->size_;
      if (0 < (long)sVar3) {
        pcVar15 = f->buffer->ptr_;
        uVar12 = sVar3 + 1;
        do {
          *piVar11 = (int)*pcVar15;
          pcVar15 = pcVar15 + 1;
          piVar11 = piVar11 + 1;
          uVar12 = uVar12 - 1;
        } while (1 < uVar12);
      }
      auVar9 = _DAT_00160db0;
      auVar8 = _DAT_0015d2a0;
      auVar7 = _DAT_0015d290;
      uVar12 = (uVar16 * 4 + uVar13 * -4) - 4;
      auVar19._8_4_ = (int)uVar12;
      auVar19._0_8_ = uVar12;
      auVar19._12_4_ = (int)(uVar12 >> 0x20);
      auVar20._0_8_ = uVar12 >> 2;
      auVar20._8_8_ = auVar19._8_8_ >> 2;
      uVar13 = 0;
      auVar20 = auVar20 ^ _DAT_0015d2a0;
      do {
        auVar24._8_4_ = (int)uVar13;
        auVar24._0_8_ = uVar13;
        auVar24._12_4_ = (int)(uVar13 >> 0x20);
        auVar27 = (auVar24 | auVar7) ^ auVar8;
        iVar22 = auVar20._4_4_;
        if ((bool)(~(auVar27._4_4_ == iVar22 && auVar20._0_4_ < auVar27._0_4_ ||
                    iVar22 < auVar27._4_4_) & 1)) {
          piVar11[uVar13] = wVar2;
        }
        if ((auVar27._12_4_ != auVar20._12_4_ || auVar27._8_4_ <= auVar20._8_4_) &&
            auVar27._12_4_ <= auVar20._12_4_) {
          piVar11[uVar13 + 1] = wVar2;
        }
        auVar27 = (auVar24 | auVar9) ^ auVar8;
        iVar29 = auVar27._4_4_;
        if (iVar29 <= iVar22 && (iVar29 != iVar22 || auVar27._0_4_ <= auVar20._0_4_)) {
          piVar11[uVar13 + 2] = wVar2;
          piVar11[uVar13 + 3] = wVar2;
        }
        uVar13 = uVar13 + 4;
      } while (((uVar12 >> 2) + 4 & 0x7ffffffffffffffc) != uVar13);
    }
  }
  return;
}

Assistant:

void write_padded(const align_spec &spec, F &&f) {
    unsigned width = spec.width(); // User-perceived width (in code points).
    size_t size = f.size(); // The number of code units.
    size_t num_code_points = width != 0 ? f.width() : size;
    if (width <= num_code_points)
      return f(reserve(size));
    auto &&it = reserve(width + (size - num_code_points));
    char_type fill = static_cast<char_type>(spec.fill());
    std::size_t padding = width - num_code_points;
    if (spec.align() == ALIGN_RIGHT) {
      it = std::fill_n(it, padding, fill);
      f(it);
    } else if (spec.align() == ALIGN_CENTER) {
      std::size_t left_padding = padding / 2;
      it = std::fill_n(it, left_padding, fill);
      f(it);
      it = std::fill_n(it, padding - left_padding, fill);
    } else {
      f(it);
      it = std::fill_n(it, padding, fill);
    }
  }